

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall HighsSparseMatrix::applyColScale(HighsSparseMatrix *this,HighsScale *scale)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer piVar7;
  long lVar8;
  long lVar9;
  
  if (this->format_ == kColwise) {
    iVar1 = this->num_col_;
    if (0 < (long)iVar1) {
      piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = 0;
      do {
        iVar2 = piVar4[lVar8];
        lVar9 = (long)iVar2;
        iVar3 = piVar4[lVar8 + 1];
        if (iVar2 < iVar3) {
          do {
            pdVar5[lVar9] = pdVar6[lVar8] * pdVar5[lVar9];
            lVar9 = lVar9 + 1;
          } while (iVar3 != lVar9);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar1);
    }
  }
  else {
    iVar1 = this->num_row_;
    if (0 < (long)iVar1) {
      piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = 0;
      do {
        iVar2 = piVar4[lVar8];
        lVar9 = (long)iVar2;
        iVar3 = piVar4[lVar8 + 1];
        if (iVar2 < iVar3) {
          do {
            pdVar6[lVar9] = pdVar5[piVar7[lVar9]] * pdVar6[lVar9];
            lVar9 = lVar9 + 1;
          } while (iVar3 != lVar9);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar1);
    }
  }
  return;
}

Assistant:

bool HighsSparseMatrix::isColwise() const {
  return this->format_ == MatrixFormat::kColwise;
}